

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

void dumpRnglistsSection(raw_ostream *OS,DWARFDataExtractor *rnglistData,
                        function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)>
                        LookupPooledAddress,DIDumpOptions DumpOpts)

{
  bool bVar1;
  ulong uVar2;
  raw_ostream *prVar3;
  uint64_t uVar4;
  Error *E;
  function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)> LookupPooledAddress_00
  ;
  string local_118;
  undefined1 local_f8 [8];
  DWARFDebugRnglistTable Rnglists;
  ulong local_48;
  uint64_t Offset;
  undefined1 local_38 [8];
  Error Err;
  
  Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length =
       LookupPooledAddress.callable;
  LookupPooledAddress_00.callback = LookupPooledAddress.callback;
  local_48 = 0;
  do {
    if ((rnglistData->super_DataExtractor).Data.Length <= local_48) {
      return;
    }
    local_f8 = (undefined1  [8])0x0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.Version = 0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.AddrSize = '\0';
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.SegSize = '\0';
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderData.OffsetEntryCount =
         0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.HeaderOffset =
         (uint64_t)anon_var_dwarf_2cb1736;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Data = (char *)0xf
    ;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.SectionName.Length =
         (long)"DW_TAG_generic_subrange" + 0x12;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.ListTypeString.Data =
         (char *)0x5;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl._0_4_ = 0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._M_color = _S_red;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._4_4_ = 0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_node_count =
         (long)"DIE address ranges are not contained in its parent\'s ranges:" + 0x35;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Data = (char *)0x7;
    Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
    super__Rb_tree_header._M_header._M_left =
         Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.ListMap._M_t._M_impl.
         super__Rb_tree_header._M_header._M_parent;
    llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extract
              ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)local_38,*rnglistData,
               (uint64_t *)local_f8);
    uVar2 = (ulong)local_38 & 0xfffffffffffffffe;
    local_38 = (undefined1  [8])(uVar2 != 0 | uVar2);
    if (uVar2 == 0) {
      bVar1 = true;
      LookupPooledAddress_00.callable =
           Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length;
      llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::dump
                ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)local_f8,OS,LookupPooledAddress_00,
                 DumpOpts);
    }
    else {
      prVar3 = llvm::WithColor::error();
      Offset = (ulong)local_38 | 1;
      local_38 = (undefined1  [8])0x0;
      llvm::toString_abi_cxx11_(&local_118,(llvm *)&Offset,E);
      prVar3 = llvm::raw_ostream::operator<<(prVar3,&local_118);
      llvm::raw_ostream::operator<<(prVar3,'\n');
      std::__cxx11::string::~string((string *)&local_118);
      if ((long *)(Offset & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(Offset & 0xfffffffffffffffe) + 8))();
      }
      uVar4 = llvm::DWARFListTableHeader::length((DWARFListTableHeader *)local_f8);
      if (uVar4 == 0) {
        bVar1 = false;
      }
      else {
        local_48 = uVar4 + local_48;
        bVar1 = true;
      }
    }
    if ((long *)((ulong)local_38 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_38 & 0xfffffffffffffffe) + 8))();
    }
    llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::~DWARFListTableBase
              ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)local_f8);
  } while (bVar1);
  return;
}

Assistant:

static void dumpRnglistsSection(
    raw_ostream &OS, DWARFDataExtractor &rnglistData,
    llvm::function_ref<Optional<object::SectionedAddress>(uint32_t)>
        LookupPooledAddress,
    DIDumpOptions DumpOpts) {
  uint64_t Offset = 0;
  while (rnglistData.isValidOffset(Offset)) {
    llvm::DWARFDebugRnglistTable Rnglists;
    uint64_t TableOffset = Offset;
    if (Error Err = Rnglists.extract(rnglistData, &Offset)) {
      WithColor::error() << toString(std::move(Err)) << '\n';
      uint64_t Length = Rnglists.length();
      // Keep going after an error, if we can, assuming that the length field
      // could be read. If it couldn't, stop reading the section.
      if (Length == 0)
        break;
      Offset = TableOffset + Length;
    } else {
      Rnglists.dump(OS, LookupPooledAddress, DumpOpts);
    }
  }
}